

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::InternalSerializeWithCachedSizesToArray
          (GeneratedCodeInfo_Annotation *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  string *psVar2;
  uint8 *puVar3;
  UnknownFieldSet *unknown_fields;
  
  if (0 < (this->path_).current_size_) {
    puVar3 = io::CodedOutputStream::WriteVarint32ToArray(10,target);
    puVar3 = io::CodedOutputStream::WriteVarint32ToArray(this->_path_cached_byte_size_,puVar3);
    target = internal::WireFormatLite::WriteInt32NoTagToArray(&this->path_,puVar3);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    psVar2 = (this->source_file_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "google.protobuf.GeneratedCodeInfo.Annotation.source_file");
    target = internal::WireFormatLite::WriteStringToArray(2,(this->source_file_).ptr_,target);
  }
  if ((uVar1 & 2) != 0) {
    target = internal::WireFormatLite::WriteInt32ToArray(3,this->begin_,target);
  }
  if ((uVar1 & 4) != 0) {
    target = internal::WireFormatLite::WriteInt32ToArray(4,this->end_,target);
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return target;
  }
  unknown_fields = GeneratedCodeInfo_Annotation::unknown_fields(this);
  puVar3 = internal::WireFormat::SerializeUnknownFieldsToArray(unknown_fields,target);
  return puVar3;
}

Assistant:

::google::protobuf::uint8* GeneratedCodeInfo_Annotation::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.GeneratedCodeInfo.Annotation)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int32 path = 1 [packed = true];
  if (this->path_size() > 0) {
    target = ::google::protobuf::internal::WireFormatLite::WriteTagToArray(
      1,
      ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
      target);
    target = ::google::protobuf::io::CodedOutputStream::WriteVarint32ToArray(
      _path_cached_byte_size_, target);
    target = ::google::protobuf::internal::WireFormatLite::
      WriteInt32NoTagToArray(this->path_, target);
  }

  cached_has_bits = _has_bits_[0];
  // optional string source_file = 2;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->source_file().data(), this->source_file().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.GeneratedCodeInfo.Annotation.source_file");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->source_file(), target);
  }

  // optional int32 begin = 3;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(3, this->begin(), target);
  }

  // optional int32 end = 4;
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(4, this->end(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.GeneratedCodeInfo.Annotation)
  return target;
}